

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::calculate_Qn_vector_positive_charge
          (singleParticleSpectra *this,int event_id,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_real_err,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *event_Qn_imag_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag_err)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iorder;
  double dVar20;
  double dVar21;
  double dVar22;
  
  iVar1 = this->order_max;
  if (0 < (long)iVar1) {
    pdVar2 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = this->npT;
    pvVar6 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (event_Qn_diff_real_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (event_Qn_diff_imag_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar18 = 0;
    do {
      pdVar2[lVar18] = 0.0;
      pdVar3[lVar18] = 0.0;
      pdVar4[lVar18] = 0.0;
      pdVar5[lVar18] = 0.0;
      if (0 < (int)uVar14) {
        lVar16 = *(long *)&pvVar6[lVar18].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar10 = *(long *)&pvVar7[lVar18].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar11 = *(long *)&pvVar8[lVar18].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar12 = *(long *)&pvVar9[lVar18].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar19 = 0;
        do {
          *(undefined8 *)(lVar16 + uVar19 * 8) = 0;
          *(undefined8 *)(lVar10 + uVar19 * 8) = 0;
          *(undefined8 *)(lVar11 + uVar19 * 8) = 0;
          *(undefined8 *)(lVar12 + uVar19 * 8) = 0;
          uVar19 = uVar19 + 1;
        } while (uVar14 != uVar19);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != iVar1);
  }
  pvVar13 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->positive_charge_hadron_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start[event_id];
  uVar14 = (int)((long)*(pointer *)
                        ((long)&pvVar13->
                                super__Vector_base<particle_info,_std::allocator<particle_info>_> +
                        8) -
                 *(long *)&pvVar13->
                           super__Vector_base<particle_info,_std::allocator<particle_info>_> >> 3) *
           -0x11111111;
  if (0 < (int)uVar14) {
    uVar19 = 0;
    do {
      lVar18 = *(long *)&(((this->particle_list).
                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          positive_charge_hadron_list->
                         super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[event_id]->
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      lVar16 = uVar19 * 0x78;
      dVar21 = *(double *)(lVar18 + 0x28 + lVar16);
      dVar20 = *(double *)(lVar18 + 0x30 + lVar16);
      if (this->rap_type == 0) {
        dVar22 = *(double *)(lVar18 + lVar16 + 8);
        dVar20 = dVar20 * dVar20 - dVar22 * dVar22;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
      }
      dVar21 = log((dVar21 + dVar20) / (dVar20 - dVar21));
      dVar21 = dVar21 * 0.5;
      if ((this->rap_min <= dVar21 && dVar21 != this->rap_min) && (dVar21 < this->rap_max)) {
        lVar18 = *(long *)&(((this->particle_list).
                             super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->positive_charge_hadron_list->
                           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                           )._M_impl.super__Vector_impl_data._M_start[event_id]->
                           super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        dVar21 = *(double *)(lVar18 + 0x18 + lVar16);
        dVar20 = *(double *)(lVar18 + 0x20 + lVar16);
        dVar22 = dVar21 * dVar21 + dVar20 * dVar20;
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        if ((this->vn_rapidity_dis_pT_min <= dVar22 && dVar22 != this->vn_rapidity_dis_pT_min) &&
           (dVar22 < this->vn_rapidity_dis_pT_max)) {
          dVar21 = atan2(dVar20,dVar21);
          uVar15 = (uint)((dVar22 - this->pT_min) / this->dpT);
          if ((-1 < (int)uVar15) && (((int)uVar15 < this->npT && (0 < this->order_max)))) {
            uVar17 = (ulong)uVar15;
            lVar18 = 0;
            lVar16 = 0;
            do {
              dVar22 = (double)(int)lVar16 * dVar21;
              dVar20 = cos(dVar22);
              dVar22 = sin(dVar22);
              pdVar2 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar2[lVar16] = pdVar2[lVar16] + dVar20;
              pdVar2 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar2[lVar16] = pdVar2[lVar16] + dVar22;
              pdVar2 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar2[lVar16] = pdVar2[lVar16] + dVar20 * dVar20;
              pdVar2 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar2[lVar16] = pdVar2[lVar16] + dVar22 * dVar22;
              lVar10 = *(long *)((long)&(((event_Qn_diff_real->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar18);
              *(double *)(lVar10 + uVar17 * 8) = dVar20 + *(double *)(lVar10 + uVar17 * 8);
              lVar10 = *(long *)((long)&(((event_Qn_diff_imag->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar18);
              *(double *)(lVar10 + uVar17 * 8) = dVar22 + *(double *)(lVar10 + uVar17 * 8);
              lVar10 = *(long *)((long)&(((event_Qn_diff_real_err->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar18);
              *(double *)(lVar10 + uVar17 * 8) = dVar20 * dVar20 + *(double *)(lVar10 + uVar17 * 8);
              lVar10 = *(long *)((long)&(((event_Qn_diff_imag_err->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar18);
              *(double *)(lVar10 + uVar17 * 8) = dVar22 * dVar22 + *(double *)(lVar10 + uVar17 * 8);
              lVar16 = lVar16 + 1;
              lVar18 = lVar18 + 0x18;
            } while (lVar16 < this->order_max);
          }
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar14 & 0x7fffffff));
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_Qn_vector_positive_charge(
    int event_id, vector<double> &event_Qn_real,
    vector<double> &event_Qn_real_err, vector<double> &event_Qn_imag,
    vector<double> &event_Qn_imag_err,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_real_err,
    vector<vector<double>> &event_Qn_diff_imag,
    vector<vector<double>> &event_Qn_diff_imag_err) {
    // first clean the results arrays
    for (int i = 0; i < order_max; i++) {
        event_Qn_real[i] = 0.0;
        event_Qn_real_err[i] = 0.0;
        event_Qn_imag[i] = 0.0;
        event_Qn_imag_err[i] = 0.0;
        for (int j = 0; j < npT; j++) {
            event_Qn_diff_real[i][j] = 0.0;
            event_Qn_diff_real_err[i][j] = 0.0;
            event_Qn_diff_imag[i][j] = 0.0;
            event_Qn_diff_imag_err[i][j] = 0.0;
        }
    }

    int number_of_particles =
        (particle_list->get_number_of_positive_particles(event_id));
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_positive_particle(event_id, i).pz;
        double E_local = particle_list->get_positive_particle(event_id, i).E;

        double rap_local;
        if (rap_type == 0) {
            double mass =
                (particle_list->get_positive_particle(event_id, i).mass);
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local =
                (particle_list->get_positive_particle(event_id, i).px);
            double py_local =
                (particle_list->get_positive_particle(event_id, i).py);
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            if (p_perp > vn_rapidity_dis_pT_min
                && p_perp < vn_rapidity_dis_pT_max) {
                double p_phi = atan2(py_local, px_local);
                int p_idx = static_cast<int>((p_perp - pT_min) / dpT);
                if (p_idx < 0 || p_idx >= npT) continue;
                for (int iorder = 0; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_real[iorder] += cos_nphi;
                    event_Qn_imag[iorder] += sin_nphi;
                    event_Qn_real_err[iorder] += cos_nphi * cos_nphi;
                    event_Qn_imag_err[iorder] += sin_nphi * sin_nphi;
                    event_Qn_diff_real[iorder][p_idx] += cos_nphi;
                    event_Qn_diff_imag[iorder][p_idx] += sin_nphi;
                    event_Qn_diff_real_err[iorder][p_idx] +=
                        cos_nphi * cos_nphi;
                    event_Qn_diff_imag_err[iorder][p_idx] +=
                        sin_nphi * sin_nphi;
                }
            }
        }
    }
}